

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O2

int Inter_ManCheckInductiveContainment(Aig_Man_t *pTrans,Aig_Man_t *pInter,int nSteps,int fBackward)

{
  int iVar1;
  Aig_Man_t *pNew;
  Cnf_Dat_t *p;
  sat_solver *s;
  uint uVar2;
  Aig_Obj_t **ppNewPis;
  ulong uVar3;
  Aig_Obj_t **ppNewPis_00;
  bool bVar4;
  Vec_Ptr_t *vMapRegs;
  
  uVar2 = pTrans->nRegs;
  if ((int)uVar2 < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intContain.c"
                  ,199,"int Inter_ManCheckInductiveContainment(Aig_Man_t *, Aig_Man_t *, int, int)")
    ;
  }
  pNew = Inter_ManFramesLatches(pTrans,nSteps,&vMapRegs);
  if (vMapRegs->nSize == (nSteps + 1) * uVar2) {
    ppNewPis_00 = (Aig_Obj_t **)vMapRegs->pArray;
    if (fBackward == 0) {
      if (nSteps < 1) {
        nSteps = 0;
      }
      uVar3 = (ulong)(uint)nSteps;
      ppNewPis = ppNewPis_00;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        Inter_ManAppendCone(pInter,pNew,ppNewPis,0);
        ppNewPis = ppNewPis + uVar2;
      }
      Inter_ManAppendCone(pInter,pNew,ppNewPis_00 + nSteps * uVar2,1);
    }
    else {
      Inter_ManAppendCone(pInter,pNew,ppNewPis_00,1);
      if (nSteps < 1) {
        nSteps = 0;
      }
      uVar3 = (ulong)(uint)nSteps;
      while (ppNewPis_00 = ppNewPis_00 + uVar2, bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        Inter_ManAppendCone(pInter,pNew,ppNewPis_00,0);
      }
    }
    free(vMapRegs->pArray);
    free(vMapRegs);
    Aig_ManCleanup(pNew);
    p = Cnf_Derive(pNew,0);
    uVar2 = 1;
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
    if (s == (sat_solver *)0x0) {
      Cnf_DataFree(p);
      Aig_ManStop(pNew);
    }
    else {
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      Cnf_DataFree(p);
      Aig_ManStop(pNew);
      sat_solver_delete(s);
      uVar2 = (uint)(iVar1 == -1);
    }
    return uVar2;
  }
  __assert_fail("Vec_PtrSize(vMapRegs) == (nSteps + 1) * nRegs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intContain.c"
                ,0xca,"int Inter_ManCheckInductiveContainment(Aig_Man_t *, Aig_Man_t *, int, int)");
}

Assistant:

int Inter_ManCheckInductiveContainment( Aig_Man_t * pTrans, Aig_Man_t * pInter, int nSteps, int fBackward )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t ** ppNodes;
    Vec_Ptr_t * vMapRegs;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int f, nRegs, status;
    nRegs = Saig_ManRegNum(pTrans);
    assert( nRegs > 0 );
    // generate the timeframes 
    pFrames = Inter_ManFramesLatches( pTrans, nSteps, &vMapRegs );
    assert( Vec_PtrSize(vMapRegs) == (nSteps + 1) * nRegs );
    // add main constraints to the timeframes
    ppNodes = (Aig_Obj_t **)Vec_PtrArray(vMapRegs);
    if ( !fBackward )
    { 
        // forward inductive check: p -> p -> ... -> !p
        for ( f = 0; f < nSteps; f++ )
            Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 0 );
        Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 1 );
    }
    else
    {
        // backward inductive check: p -> !p -> ... -> !p
        Inter_ManAppendCone( pInter, pFrames, ppNodes + 0 * nRegs, 1 );
        for ( f = 1; f <= nSteps; f++ )
            Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 0 );
    }
    Vec_PtrFree( vMapRegs );
    Aig_ManCleanup( pFrames );

    // convert to CNF
    pCnf = Cnf_Derive( pFrames, 0 ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//    Cnf_DataFree( pCnf );
//    Aig_ManStop( pFrames );

    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        Aig_ManStop( pFrames );
        return 1;
    }

     // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );

//    Inter_ManCheckUniqueness( pTrans, pSat, pCnf, nSteps );

    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );

    sat_solver_delete( pSat );
    return status == l_False;
}